

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

int amqp_destroy_connection(amqp_connection_state_t state)

{
  undefined8 *puVar1;
  void *in_RDI;
  amqp_pool_table_entry_t *todelete;
  amqp_pool_table_entry_t *entry;
  int i;
  int status;
  undefined8 local_18;
  undefined4 local_10;
  
  if (in_RDI != (void *)0x0) {
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      local_18 = *(undefined8 **)((long)in_RDI + (long)local_10 * 8);
      while (local_18 != (undefined8 *)0x0) {
        empty_amqp_pool((amqp_pool_t *)0x105b10);
        puVar1 = (undefined8 *)*local_18;
        free(local_18);
        local_18 = puVar1;
      }
    }
    free(*(void **)((long)in_RDI + 0xd0));
    free(*(void **)((long)in_RDI + 0xe8));
    amqp_socket_delete((amqp_socket_t *)0x105b6b);
    empty_amqp_pool((amqp_pool_t *)0x105b7c);
    free(in_RDI);
  }
  return 0;
}

Assistant:

int amqp_destroy_connection(amqp_connection_state_t state) {
  int status = AMQP_STATUS_OK;
  if (state) {
    int i;
    for (i = 0; i < POOL_TABLE_SIZE; ++i) {
      amqp_pool_table_entry_t *entry = state->pool_table[i];
      while (NULL != entry) {
        amqp_pool_table_entry_t *todelete = entry;
        empty_amqp_pool(&entry->pool);
        entry = entry->next;
        free(todelete);
      }
    }

    free(state->outbound_buffer.bytes);
    free(state->sock_inbound_buffer.bytes);
    amqp_socket_delete(state->socket);
    empty_amqp_pool(&state->properties_pool);
    free(state);
  }
  return status;
}